

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O3

void * dlopen(char *filename,int flag)

{
  char *__s;
  int iVar1;
  void *pvVar2;
  size_t __n;
  long lVar3;
  
  pvVar2 = dlwrap_real_dlopen(filename,flag);
  if (filename != (char *)0x0) {
    lVar3 = 0;
    do {
      __s = *(char **)((long)&wrapped_libs[0].filename + lVar3);
      __n = strlen(__s);
      iVar1 = strncmp(__s,filename,__n);
      if (iVar1 == 0) {
        *(void **)((long)&wrapped_libs[0].handle + lVar3) = pvVar2;
        return (void *)((long)&wrapped_libs[0].filename + lVar3);
      }
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x48);
  }
  return pvVar2;
}

Assistant:

void *
dlopen(const char *filename, int flag)
{
    void *ret;
    struct libwrap *wrap;

    /* Before deciding whether to redirect this dlopen to our own
     * library, we call the real dlopen. This assures that any
     * expected side-effects from loading the intended library are
     * resolved. Below, we may still return a handle pointing to
     * our own library, and not what is opened here. */
    ret = dlwrap_real_dlopen(filename, flag);

    /* If filename is not a wrapped library, just return real dlopen */
    wrap = find_wrapped_library(filename);
    if (!wrap)
        return ret;

    wrap->handle = ret;

    /* We use wrapped_libs as our handles to libraries. */
    return wrap;
}